

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_8a;
  allocator local_89;
  string subfolder;
  string local_68;
  string local_48;
  
  progname = *argv;
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  while( true ) {
    iVar1 = getopt(argc,argv,"K:vh");
    if (iVar1 != 0x4b) break;
    std::__cxx11::string::assign((char *)&subfolder);
  }
  if (iVar1 == -1) {
    if (subfolder._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_48,"",&local_89);
      std::__cxx11::string::string((string *)&local_68,"",&local_8a);
      initstreams(&local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      summaryindex::doit(&subfolder);
      std::__cxx11::string::~string((string *)&subfolder);
      return 0;
    }
    fwrite("FATAL: No folder supplied for summarycalc files\n",0x30,1,_stderr);
  }
  else if (iVar1 == 0x76) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	while ((opt = getopt(argc, argv, (char *)"K:vh")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	initstreams();
	try {
		summaryindex::doit(subfolder);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}